

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void notch::core::Init::normalXavier
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Array *weights,int n_in,int param_4)

{
  anon_class_16_2_74ab9900 __gen;
  float *__first;
  float *__last;
  double local_50;
  undefined1 local_34 [8];
  normal_distribution<float> nd;
  float sigma;
  int param_3_local;
  int n_in_local;
  Array *weights_local;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  *rng_local;
  
  nd._12_4_ = param_4;
  if (n_in < 1) {
    local_50 = 1.0;
  }
  else {
    local_50 = sqrt(1.0 / (double)n_in);
  }
  nd._M_saved = (result_type_conflict1)local_50;
  std::normal_distribution<float>::normal_distribution
            ((normal_distribution<float> *)local_34,0.0,nd._M_saved);
  __first = std::begin<float>(weights);
  __last = std::end<float>(weights);
  __gen.rng = rng;
  __gen.nd = (normal_distribution<float> *)local_34;
  ::std::
  generate<float*,notch::core::Init::normalXavier(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)::_lambda()_1_>
            (__first,__last,__gen);
  return;
}

Assistant:

static
    void normalXavier(std::unique_ptr<RNG> &rng, Array &weights, int n_in, int) {
        float sigma = n_in > 0 ? sqrt(1.0 / n_in) : 1.0;
        std::normal_distribution<float> nd(0.0, sigma);
        std::generate(std::begin(weights), std::end(weights), [&nd, &rng] {
            float w = nd(*rng.get());
            return w;
        });
    }